

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusRcOutAlpha::adjust_orig_mthd(MthdCelsiusRcOutAlpha *this)

{
  result_type rVar1;
  MthdCelsiusRcOutAlpha *this_local;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0x3ffff;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xcfffffff | 0x10000000;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xffffcfff;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xfffffff0 | 0xd;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xffffff0f | 0xd0;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xfffff0ff | 0xd00;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar1 & 0x1f) | (this->super_SingleMthdTest).super_MthdTest.val;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar1 & 0x1f) | (this->super_SingleMthdTest).super_MthdTest.val;
    }
  }
  adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 1) {
				insrt(val, 18, 14, 0);
			}
			if (rnd() & 1) {
				insrt(val, 28, 2, 1);
			}
			if (rnd() & 1) {
				insrt(val, 12, 2, 0);
			}
			if (rnd() & 1) {
				insrt(val, 0, 4, 0xd);
			}
			if (rnd() & 1) {
				insrt(val, 4, 4, 0xd);
			}
			if (rnd() & 1) {
				insrt(val, 8, 4, 0xd);
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
			}
		}
		adjust_orig_icmd(&orig);
	}